

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

CLOSE_HANDLE close_clone(CLOSE_HANDLE value)

{
  CLOSE_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (CLOSE_HANDLE)malloc(8);
  if (__ptr != (CLOSE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (CLOSE_HANDLE)0x0;
}

Assistant:

CLOSE_HANDLE close_clone(CLOSE_HANDLE value)
{
    CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)malloc(sizeof(CLOSE_INSTANCE));
    if (close_instance != NULL)
    {
        close_instance->composite_value = amqpvalue_clone(((CLOSE_INSTANCE*)value)->composite_value);
        if (close_instance->composite_value == NULL)
        {
            free(close_instance);
            close_instance = NULL;
        }
    }

    return close_instance;
}